

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyph.cc
# Opt level: O1

bool woff2::StoreGlyph(Glyph *glyph,uint8_t *dst,size_t *dst_size)

{
  pointer pvVar1;
  pointer pPVar2;
  long lVar3;
  pointer pvVar4;
  bool bVar5;
  int iVar6;
  ushort uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  pointer pvVar11;
  uint uVar12;
  int iVar13;
  uint8_t uVar14;
  pointer pPVar15;
  Point *point;
  uint uVar16;
  int iVar17;
  int iVar18;
  size_t sVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  
  uVar9 = (ulong)glyph->composite_data_size;
  if (uVar9 == 0) {
    pvVar11 = (glyph->contours).
              super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(glyph->contours).
                  super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar11;
    if (lVar8 == 0) {
      sVar19 = 0;
    }
    else {
      lVar8 = lVar8 >> 3;
      uVar9 = lVar8 * -0x5555555555555555;
      if ((0x7fff < uVar9) ||
         (*dst_size < (ulong)glyph->instructions_size + lVar8 * 0x5555555555555556 + 0xc))
      goto LAB_00108429;
      uVar7 = (ushort)uVar9;
      *(ushort *)dst = uVar7 << 8 | uVar7 >> 8;
      *(ushort *)(dst + 2) = glyph->x_min << 8 | (ushort)glyph->x_min >> 8;
      *(ushort *)(dst + 4) = glyph->y_min << 8 | (ushort)glyph->y_min >> 8;
      *(ushort *)(dst + 6) = glyph->x_max << 8 | (ushort)glyph->x_max >> 8;
      *(ushort *)(dst + 8) = glyph->y_max << 8 | (ushort)glyph->y_max >> 8;
      pvVar1 = (glyph->contours).
               super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = 10;
      bVar21 = pvVar11 == pvVar1;
      if ((!bVar21) &&
         (uVar9 = ((long)(pvVar11->
                         super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar11->
                         super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
         lVar10 = uVar9 - 1, (int)lVar10 < 0x10000 && uVar9 < 0x10000)) {
        lVar3 = 0xc;
        do {
          lVar8 = lVar3;
          pvVar4 = pvVar11 + 1;
          *(ushort *)(dst + lVar8 + -2) = (ushort)lVar10 << 8 | (ushort)lVar10 >> 8;
          bVar21 = pvVar4 == pvVar1;
          if ((bVar21) ||
             (uVar9 = ((long)pvVar11[1].
                             super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar4->
                             super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
             0xffff < uVar9)) break;
          lVar10 = uVar9 + (long)(int)lVar10;
          lVar3 = lVar8 + 2;
          pvVar11 = pvVar4;
        } while ((int)lVar10 < 0x10000);
      }
      iVar18 = 0;
      if (!bVar21) goto LAB_0010843e;
      *(uint16_t *)(dst + lVar8) = glyph->instructions_size << 8 | glyph->instructions_size >> 8;
      uVar7 = glyph->instructions_size;
      memcpy((ushort *)((long)(dst + lVar8) + 2),glyph->instructions_data,(ulong)uVar7);
      sVar19 = (ulong)uVar7 + lVar8 + 2;
      uVar9 = *dst_size;
      pvVar11 = (glyph->contours).
                super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar1 = (glyph->contours).
               super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar21 = pvVar11 == pvVar1;
      if (bVar21) {
        lVar10 = 0;
        lVar8 = 0;
      }
      else {
        bVar21 = false;
        uVar16 = 0xffffffff;
        iVar18 = 0;
        iVar13 = 0;
        iVar17 = 0;
        lVar8 = 0;
        lVar10 = 0;
        do {
          pPVar2 = (pvVar11->
                   super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pPVar15 = (pvVar11->
                         super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                         )._M_impl.super__Vector_impl_data._M_start; bVar22 = pPVar15 != pPVar2,
              bVar22; pPVar15 = pPVar15 + 1) {
            uVar12 = (uint)pPVar15->on_curve;
            iVar6 = pPVar15->x - iVar13;
            if (iVar6 == 0) {
              uVar12 = uVar12 | 0x10;
            }
            else if (iVar6 + 0xffU < 0x1ff) {
              uVar12 = uVar12 + (uint)(0 < iVar6) * 0x10 + 2;
              lVar8 = lVar8 + 1;
            }
            else {
              lVar8 = lVar8 + 2;
            }
            if (pPVar15->y == iVar17) {
              uVar12 = uVar12 | 0x20;
            }
            else {
              iVar6 = pPVar15->y - iVar17;
              if (iVar6 + 0xffU < 0x1ff) {
                uVar12 = (uint)(0 < iVar6) << 5 | uVar12 | 4;
                lVar10 = lVar10 + 1;
              }
              else {
                lVar10 = lVar10 + 2;
              }
            }
            if (iVar18 == 0xff || uVar12 != uVar16) {
              if (iVar18 == 0) {
LAB_0010861f:
                bVar5 = false;
                if (sVar19 < uVar9) {
                  dst[sVar19] = (uint8_t)uVar12;
                  sVar19 = sVar19 + 1;
                  iVar18 = 0;
                  goto LAB_0010862f;
                }
              }
              else {
                if (sVar19 < uVar9) {
                  dst[sVar19] = (uint8_t)iVar18;
                  sVar19 = sVar19 + 1;
                  goto LAB_0010861f;
                }
                bVar5 = false;
              }
            }
            else {
              dst[sVar19 - 1] = dst[sVar19 - 1] | 8;
              iVar18 = iVar18 + 1;
LAB_0010862f:
              iVar13 = pPVar15->x;
              iVar17 = pPVar15->y;
              bVar5 = true;
              uVar16 = uVar12;
            }
            if (!bVar5) break;
          }
          if (bVar22) break;
          pvVar11 = pvVar11 + 1;
          bVar21 = pvVar11 == pvVar1;
        } while (!bVar21);
      }
      if (bVar21) {
        uVar20 = sVar19;
        if (iVar18 != 0) {
          if (uVar9 <= sVar19) goto LAB_0010870e;
          dst[sVar19] = (uint8_t)iVar18;
          uVar20 = sVar19 + 1;
        }
        sVar19 = lVar8 + uVar20;
        if (uVar9 < lVar10 + sVar19) {
          bVar21 = false;
          sVar19 = uVar20;
        }
        else {
          pvVar11 = (glyph->contours).
                    super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar1 = (glyph->contours).
                   super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar21 = true;
          if (pvVar11 != pvVar1) {
            iVar13 = 0;
            iVar18 = 0;
            do {
              pPVar2 = (pvVar11->
                       super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pPVar15 = (pvVar11->
                             super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                             )._M_impl.super__Vector_impl_data._M_start; pPVar15 != pPVar2;
                  pPVar15 = pPVar15 + 1) {
                iVar17 = pPVar15->x;
                iVar6 = pPVar15->y;
                iVar13 = iVar17 - iVar13;
                if (iVar13 != 0) {
                  if (iVar13 + 0xffU < 0x1ff) {
                    uVar14 = -(uint8_t)iVar13;
                    if (0 < iVar13) {
                      uVar14 = (uint8_t)iVar13;
                    }
                    dst[uVar20] = uVar14;
                    uVar20 = uVar20 + 1;
                  }
                  else {
                    *(ushort *)(dst + uVar20) = (ushort)iVar13 << 8 | (ushort)iVar13 >> 8;
                    uVar20 = uVar20 + 2;
                  }
                }
                if (iVar6 != iVar18) {
                  iVar18 = iVar6 - iVar18;
                  if (iVar18 + 0xffU < 0x1ff) {
                    uVar14 = -(uint8_t)iVar18;
                    if (0 < iVar18) {
                      uVar14 = (uint8_t)iVar18;
                    }
                    dst[sVar19] = uVar14;
                    sVar19 = sVar19 + 1;
                  }
                  else {
                    *(ushort *)(dst + sVar19) = (ushort)iVar18 << 8 | (ushort)iVar18 >> 8;
                    sVar19 = sVar19 + 2;
                  }
                }
                iVar18 = iVar6;
                iVar13 = iVar17;
              }
              pvVar11 = pvVar11 + 1;
            } while (pvVar11 != pvVar1);
          }
        }
      }
      else {
LAB_0010870e:
        bVar21 = false;
      }
      if (!bVar21) goto LAB_00108429;
    }
  }
  else {
    if (*dst_size < glyph->instructions_size + uVar9 + 10 + (ulong)glyph->have_instructions * 2) {
LAB_00108429:
      iVar18 = 0;
      goto LAB_0010843e;
    }
    dst[0] = 0xff;
    dst[1] = 0xff;
    *(ushort *)(dst + 2) = glyph->x_min << 8 | (ushort)glyph->x_min >> 8;
    *(ushort *)(dst + 4) = glyph->y_min << 8 | (ushort)glyph->y_min >> 8;
    *(ushort *)(dst + 6) = glyph->x_max << 8 | (ushort)glyph->x_max >> 8;
    *(ushort *)(dst + 8) = glyph->y_max << 8 | (ushort)glyph->y_max >> 8;
    memcpy(dst + 10,glyph->composite_data,uVar9);
    if (glyph->have_instructions == true) {
      *(uint16_t *)(dst + uVar9 + 10) =
           glyph->instructions_size << 8 | glyph->instructions_size >> 8;
      uVar7 = glyph->instructions_size;
      memcpy(dst + uVar9 + 0xc,glyph->instructions_data,(ulong)uVar7);
      sVar19 = uVar9 + uVar7 + 0xc;
    }
    else {
      sVar19 = uVar9 + 10;
    }
  }
  *dst_size = sVar19;
  iVar18 = 1;
LAB_0010843e:
  return SUB41(iVar18,0);
}

Assistant:

bool StoreGlyph(const Glyph& glyph, uint8_t* dst, size_t* dst_size) {
  size_t offset = 0;
  if (glyph.composite_data_size > 0) {
    // Composite glyph.
    if (*dst_size < ((10ULL + glyph.composite_data_size) +
                     ((glyph.have_instructions ? 2ULL : 0) +
                      glyph.instructions_size))) {
      return FONT_COMPRESSION_FAILURE();
    }
    Store16(-1, &offset, dst);
    StoreBbox(glyph, &offset, dst);
    StoreBytes(glyph.composite_data, glyph.composite_data_size, &offset, dst);
    if (glyph.have_instructions) {
      StoreInstructions(glyph, &offset, dst);
    }
  } else if (glyph.contours.size() > 0) {
    // Simple glyph.
    if (glyph.contours.size() > std::numeric_limits<int16_t>::max()) {
      return FONT_COMPRESSION_FAILURE();
    }
    if (*dst_size < ((12ULL + 2 * glyph.contours.size()) +
                     glyph.instructions_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
    Store16(glyph.contours.size(), &offset, dst);
    StoreBbox(glyph, &offset, dst);
    if (!StoreEndPtsOfContours(glyph, &offset, dst)) {
      return FONT_COMPRESSION_FAILURE();
    }
    StoreInstructions(glyph, &offset, dst);
    if (!StorePoints(glyph, &offset, dst, *dst_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
  }
  *dst_size = offset;
  return true;
}